

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

uint ZSTDMT_computeTargetJobLog(ZSTD_CCtx_params *params)

{
  uint uVar1;
  uint uVar2;
  
  if ((params->ldmParams).enableLdm == 0) {
    uVar2 = (params->cParams).windowLog + 2;
    if (0x13 < uVar2) goto LAB_00144292;
    uVar2 = 0x14;
  }
  else {
    uVar2 = (params->cParams).chainLog + 4;
    if (0x14 < uVar2) {
LAB_00144292:
      uVar1 = 0x1e;
      if (uVar2 < 0x1e) {
        uVar1 = uVar2;
      }
      return uVar1;
    }
    uVar2 = 0x15;
  }
  return uVar2;
}

Assistant:

static unsigned ZSTDMT_computeTargetJobLog(const ZSTD_CCtx_params* params)
{
    unsigned jobLog;
    if (params->ldmParams.enableLdm) {
        /* In Long Range Mode, the windowLog is typically oversized.
         * In which case, it's preferable to determine the jobSize
         * based on chainLog instead. */
        jobLog = MAX(21, params->cParams.chainLog + 4);
    } else {
        jobLog = MAX(20, params->cParams.windowLog + 2);
    }
    return MIN(jobLog, (unsigned)ZSTDMT_JOBLOG_MAX);
}